

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcondensedcompel.cpp
# Opt level: O2

void __thiscall TPZCondensedCompEl::Unwrap(TPZCondensedCompEl *this)

{
  int64_t nelem;
  TPZCompEl *this_00;
  int iVar1;
  TPZCompEl **ppTVar2;
  long lVar3;
  TPZGeoEl *pTVar4;
  TPZCompMesh *pTVar5;
  TPZCompEl **ppTVar6;
  int iVar7;
  
  nelem = (this->super_TPZCompEl).fIndex;
  ppTVar2 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                      (&(((this->super_TPZCompEl).fMesh)->fElementVec).
                        super_TPZChunkVector<TPZCompEl_*,_10>,nelem);
  *ppTVar2 = (TPZCompEl *)0x0;
  this_00 = this->fReferenceCompEl;
  iVar1 = (**(code **)(*(long *)&this->super_TPZCompEl + 0x90))(this);
  iVar7 = 0;
  if (iVar1 < 1) {
    iVar1 = iVar7;
  }
  for (; iVar1 != iVar7; iVar7 = iVar7 + 1) {
    lVar3 = (**(code **)(*(long *)&this->super_TPZCompEl + 0xa8))(this,iVar7);
    *(undefined1 *)(lVar3 + 0x17) = 0;
  }
  pTVar4 = TPZCompEl::Reference(&this->super_TPZCompEl);
  if (pTVar4 == (TPZGeoEl *)0x0) {
    (**(code **)(*(long *)&this->super_TPZCompEl + 8))(this);
    pTVar5 = TPZCompEl::Mesh(this_00);
    ppTVar2 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                        (&(pTVar5->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,nelem);
  }
  else {
    ppTVar2 = &pTVar4->fReference;
    pTVar4->fReference = (TPZCompEl *)0x0;
    (**(code **)(*(long *)&this->super_TPZCompEl + 8))(this);
    pTVar5 = TPZCompEl::Mesh(this_00);
    ppTVar6 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                        (&(pTVar5->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,nelem);
    *ppTVar6 = this_00;
  }
  *ppTVar2 = this_00;
  return;
}

Assistant:

void TPZCondensedCompEl::Unwrap()
{
    int64_t myindex = fIndex;
    fMesh->ElementVec()[myindex] = 0;
    TPZCompEl *ReferenceEl = fReferenceCompEl;
    int ncon = NConnects();
    for (int ic=0; ic<ncon ; ic++) {
        Connect(ic).SetCondensed(false);
    }
    TPZGeoEl *gel = Reference();
    if (gel) {
        gel->ResetReference();
    }
    delete this;
    ReferenceEl->Mesh()->ElementVec()[myindex] = ReferenceEl;
    if (gel) {
        gel->SetReference(ReferenceEl);
    }
}